

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Instance>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  Deleter<vk::VkInstance_s_*> **ppDVar2;
  bool bVar3;
  int iVar4;
  VkAllocationCallbacks *pVVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  VkApplicationInfo appInfo;
  EnvClone resEnv;
  VkInstanceCreateInfo local_878;
  Move<vk::VkInstance_s_*> local_838;
  Environment local_820;
  AllocationCallbackRecorder local_7e8;
  AllocationCallbackRecorder local_788;
  VkApplicationInfo local_728;
  EnvClone local_6f0;
  
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_788,pVVar5,0x80);
  pPVar1 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  local_820.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_820.programBinaries = context->m_progCollection;
  local_820.allocationCallbacks =
       &local_788.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_820.maxResourceConsumers = 1;
  local_820.vkp = pPVar1;
  local_820.vkd = pDVar6;
  local_820.device = pVVar7;
  iVar4 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_7e8.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)((ulong)(iVar4 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_6f0,&local_820,(Parameters *)&local_7e8,iVar4 - 1U);
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7e8,pVVar5,0x80);
  local_878.pApplicationInfo = &local_728;
  local_728.pEngineName = (char *)0x0;
  local_728.pApplicationName = (char *)0x0;
  local_728.applicationVersion = 0;
  local_728._28_4_ = 0;
  local_728.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_728._4_4_ = 0;
  local_728.pNext = (void *)0x0;
  local_728.engineVersion = 0;
  local_728.apiVersion = 0x400000;
  local_878.pNext = (void *)0x0;
  local_878._16_8_ = 0;
  local_878.enabledExtensionCount = 0;
  local_878._52_4_ = 0;
  local_878.ppEnabledExtensionNames = (char **)0x0;
  local_878.enabledLayerCount = 0;
  local_878._36_4_ = 0;
  local_878.ppEnabledLayerNames = (char **)0x0;
  local_878._0_8_ = &DAT_00000001;
  ::vk::createInstance
            (&local_838,local_6f0.env.vkp,&local_878,
             &local_7e8.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7e8,0x1e);
  if (bVar3) {
    if (local_838.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
      (*local_838.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
                (local_838.super_RefBase<vk::VkInstance_s_*>.m_data.object,
                 local_838.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
    }
LAB_003f0f98:
    bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7e8,0);
    if (bVar3) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7e8);
      ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
      if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
      if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
           (VkInstance_s *)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance = (DestroyInstanceFunc)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_788,0);
      ppDVar2 = (Deleter<vk::VkInstance_s_*> **)
                &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                 deleter;
      local_6f0.deviceRes.instance._0_8_ = ppDVar2;
      if (bVar3) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"Ok","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6f0.deviceRes.instance._0_8_,
                   local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6f0.deviceRes.instance._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6f0,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6f0.deviceRes.instance._0_8_,
                   local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6f0.deviceRes.instance._0_8_);
      }
      if ((Deleter<vk::VkInstance_s_*> **)local_6f0.deviceRes.instance._0_8_ != ppDVar2) {
        operator_delete((void *)local_6f0.deviceRes.instance._0_8_,
                        (ulong)(local_6f0.deviceRes.instance.object.
                                super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance +
                               1));
      }
      goto LAB_003f1200;
    }
    local_878._0_8_ = (undefined1 *)((long)&local_878 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_878,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_878._0_8_,
               (undefined1 *)((long)local_878.pNext + local_878._0_8_));
    if ((undefined1 *)local_878._0_8_ != (undefined1 *)((long)&local_878 + 0x10U)) {
      operator_delete((void *)local_878._0_8_,local_878._16_8_ + 1);
    }
  }
  else {
    local_878._0_8_ = (undefined1 *)((long)&local_878 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_878,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_878._0_8_,
               (undefined1 *)((long)local_878.pNext + local_878._0_8_));
    if ((undefined1 *)local_878._0_8_ != (undefined1 *)((long)&local_878 + 0x10U)) {
      operator_delete((void *)local_878._0_8_,local_878._16_8_ + 1);
    }
    if (local_838.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
      (*local_838.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
                (local_838.super_RefBase<vk::VkInstance_s_*>.m_data.object,
                 local_838.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
    }
    if (bVar3) goto LAB_003f0f98;
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7e8);
  ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
  if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
  if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
       (VkInstance_s *)0x0;
  local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
  m_destroyInstance = (DestroyInstanceFunc)0x0;
  local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
LAB_003f1200:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_788);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}